

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O2

void __thiscall
Scope::ForceAllSymbolNonLocalReference(Scope *this,ByteCodeGenerator *byteCodeGenerator)

{
  undefined1 *puVar1;
  Symbol *pSVar2;
  bool bVar3;
  Symbol *this_00;
  
  pSVar2 = this->m_symList;
  while (this_00 = pSVar2, this_00 != (Symbol *)0x0) {
    pSVar2 = this_00->next;
    bVar3 = Symbol::IsArguments(this_00);
    if (!bVar3) {
      bVar3 = Symbol::IsSpecialSymbol(this_00);
      if (!bVar3) {
        Symbol::SetHasNonLocalReference(this_00);
        ByteCodeGenerator::ProcessCapturedSym(byteCodeGenerator,this_00);
        puVar1 = &this->func->field_0xb4;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x40;
      }
    }
  }
  return;
}

Assistant:

void Scope::ForceAllSymbolNonLocalReference(ByteCodeGenerator *byteCodeGenerator)
{
    this->ForEachSymbol([this, byteCodeGenerator](Symbol *const sym)
    {
        if (!sym->IsArguments() && !sym->IsSpecialSymbol())
        {
            sym->SetHasNonLocalReference();
            byteCodeGenerator->ProcessCapturedSym(sym);
            this->GetFunc()->SetHasLocalInClosure(true);
        }
    });
}